

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_db_status(sqlite3 *db,int op,int *pCurrent,int *pHighwater,int resetFlag)

{
  ushort uVar1;
  long lVar2;
  Schema *pSVar3;
  Vdbe *p;
  void *pvVar4;
  sqlite3_pcache *psVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  Vdbe **ppVVar12;
  HashElem *pHVar13;
  int nByte;
  int *local_50;
  int *local_48;
  int nByte_1;
  ulong local_38;
  
  local_50 = pCurrent;
  local_48 = pHighwater;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  switch(op) {
  case 0:
    *local_50 = (db->lookaside).nOut;
    *local_48 = (db->lookaside).mxOut;
    iVar11 = 0;
    if (resetFlag != 0) {
      (db->lookaside).mxOut = (db->lookaside).nOut;
    }
    goto LAB_00133434;
  case 1:
    sqlite3BtreeEnterAll(db);
    lVar10 = 8;
    iVar11 = 0;
    for (lVar8 = 0; lVar8 < db->nDb; lVar8 = lVar8 + 1) {
      lVar2 = *(long *)((long)&db->aDb->zName + lVar10);
      if (lVar2 != 0) {
        pvVar4 = (void *)**(undefined8 **)(lVar2 + 8);
        uVar9 = *(uint *)((long)pvVar4 + 0xbc);
        uVar1 = *(ushort *)((long)pvVar4 + 0xb0);
        psVar5 = *(sqlite3_pcache **)(*(long *)((long)pvVar4 + 0x110) + 0x40);
        if (psVar5 == (sqlite3_pcache *)0x0) {
          iVar6 = 0;
        }
        else {
          local_38 = (ulong)uVar9;
          iVar6 = (*sqlite3Config.pcache2.xPagecount)(psVar5);
          uVar9 = (uint)local_38;
        }
        iVar7 = (*sqlite3Config.m.xSize)(pvVar4);
        iVar11 = iVar11 + iVar7 + (uVar1 + uVar9 + 0x70) * iVar6 + *(int *)((long)pvVar4 + 0xbc);
      }
      lVar10 = lVar10 + 0x20;
    }
    sqlite3BtreeLeaveAll(db);
    *local_50 = iVar11;
    *local_48 = 0;
    break;
  case 2:
    nByte = 0;
    sqlite3BtreeEnterAll(db);
    db->pnBytesFreed = &nByte;
    for (lVar10 = 0; lVar10 < db->nDb; lVar10 = lVar10 + 1) {
      pSVar3 = db->aDb[lVar10].pSchema;
      if (pSVar3 != (Schema *)0x0) {
        iVar11 = (*sqlite3Config.m.xRoundup)(0x28);
        nByte = nByte + ((pSVar3->trigHash).count + (pSVar3->tblHash).count +
                         (pSVar3->idxHash).count + (pSVar3->fkeyHash).count) * iVar11;
        iVar11 = (*sqlite3Config.m.xSize)((pSVar3->tblHash).ht);
        nByte = nByte + iVar11;
        iVar11 = (*sqlite3Config.m.xSize)((pSVar3->trigHash).ht);
        nByte = nByte + iVar11;
        iVar11 = (*sqlite3Config.m.xSize)((pSVar3->idxHash).ht);
        nByte = nByte + iVar11;
        iVar11 = (*sqlite3Config.m.xSize)((pSVar3->fkeyHash).ht);
        nByte = nByte + iVar11;
        pHVar13 = (HashElem *)&(pSVar3->trigHash).first;
        while (pHVar13 = pHVar13->next, pHVar13 != (HashElem *)0x0) {
          sqlite3DeleteTrigger(db,(Trigger *)pHVar13->data);
        }
        pHVar13 = (HashElem *)&(pSVar3->tblHash).first;
        while (pHVar13 = pHVar13->next, pHVar13 != (HashElem *)0x0) {
          sqlite3DeleteTable(db,(Table *)pHVar13->data);
        }
      }
    }
    db->pnBytesFreed = (int *)0x0;
    sqlite3BtreeLeaveAll(db);
    *local_48 = 0;
    iVar11 = nByte;
    goto LAB_0013334a;
  case 3:
    nByte_1 = 0;
    db->pnBytesFreed = &nByte_1;
    ppVVar12 = &db->pVdbe;
    while (p = *ppVVar12, p != (Vdbe *)0x0) {
      sqlite3VdbeClearObject(db,p);
      sqlite3DbFree(db,p);
      ppVVar12 = &p->pNext;
    }
    db->pnBytesFreed = (int *)0x0;
    *local_48 = 0;
    iVar11 = nByte_1;
LAB_0013334a:
    *local_50 = iVar11;
    break;
  case 4:
  case 5:
  case 6:
    *local_50 = 0;
    *local_48 = (db->lookaside).anStat[op - 4U];
    iVar11 = 0;
    if (resetFlag != 0) {
      (db->lookaside).anStat[op - 4U] = 0;
    }
    goto LAB_00133434;
  case 7:
  case 8:
  case 9:
    lVar10 = 8;
    iVar11 = 0;
    for (lVar8 = 0; lVar8 < db->nDb; lVar8 = lVar8 + 1) {
      lVar2 = *(long *)((long)&db->aDb->zName + lVar10);
      if (lVar2 != 0) {
        lVar2 = **(long **)(lVar2 + 8);
        iVar11 = iVar11 + *(int *)(lVar2 + 0xf0 + (ulong)(op - 7) * 4);
        if (resetFlag != 0) {
          *(undefined4 *)(lVar2 + 0xf0 + (ulong)(op - 7) * 4) = 0;
        }
      }
      lVar10 = lVar10 + 0x20;
    }
    *local_48 = 0;
    *local_50 = iVar11;
    break;
  default:
    iVar11 = 1;
    goto LAB_00133434;
  }
  iVar11 = 0;
LAB_00133434:
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar11;
}

Assistant:

SQLITE_API int sqlite3_db_status(
  sqlite3 *db,          /* The database connection whose status is desired */
  int op,               /* Status verb */
  int *pCurrent,        /* Write current value here */
  int *pHighwater,      /* Write high-water mark here */
  int resetFlag         /* Reset high-water mark if true */
){
  int rc = SQLITE_OK;   /* Return code */
  sqlite3_mutex_enter(db->mutex);
  switch( op ){
    case SQLITE_DBSTATUS_LOOKASIDE_USED: {
      *pCurrent = db->lookaside.nOut;
      *pHighwater = db->lookaside.mxOut;
      if( resetFlag ){
        db->lookaside.mxOut = db->lookaside.nOut;
      }
      break;
    }

    case SQLITE_DBSTATUS_LOOKASIDE_HIT:
    case SQLITE_DBSTATUS_LOOKASIDE_MISS_SIZE:
    case SQLITE_DBSTATUS_LOOKASIDE_MISS_FULL: {
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_HIT );
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_MISS_SIZE );
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_MISS_FULL );
      assert( (op-SQLITE_DBSTATUS_LOOKASIDE_HIT)>=0 );
      assert( (op-SQLITE_DBSTATUS_LOOKASIDE_HIT)<3 );
      *pCurrent = 0;
      *pHighwater = db->lookaside.anStat[op - SQLITE_DBSTATUS_LOOKASIDE_HIT];
      if( resetFlag ){
        db->lookaside.anStat[op - SQLITE_DBSTATUS_LOOKASIDE_HIT] = 0;
      }
      break;
    }

    /* 
    ** Return an approximation for the amount of memory currently used
    ** by all pagers associated with the given database connection.  The
    ** highwater mark is meaningless and is returned as zero.
    */
    case SQLITE_DBSTATUS_CACHE_USED: {
      int totalUsed = 0;
      int i;
      sqlite3BtreeEnterAll(db);
      for(i=0; i<db->nDb; i++){
        Btree *pBt = db->aDb[i].pBt;
        if( pBt ){
          Pager *pPager = sqlite3BtreePager(pBt);
          totalUsed += sqlite3PagerMemUsed(pPager);
        }
      }
      sqlite3BtreeLeaveAll(db);
      *pCurrent = totalUsed;
      *pHighwater = 0;
      break;
    }

    /*
    ** *pCurrent gets an accurate estimate of the amount of memory used
    ** to store the schema for all databases (main, temp, and any ATTACHed
    ** databases.  *pHighwater is set to zero.
    */
    case SQLITE_DBSTATUS_SCHEMA_USED: {
      int i;                      /* Used to iterate through schemas */
      int nByte = 0;              /* Used to accumulate return value */

      sqlite3BtreeEnterAll(db);
      db->pnBytesFreed = &nByte;
      for(i=0; i<db->nDb; i++){
        Schema *pSchema = db->aDb[i].pSchema;
        if( ALWAYS(pSchema!=0) ){
          HashElem *p;

          nByte += sqlite3GlobalConfig.m.xRoundup(sizeof(HashElem)) * (
              pSchema->tblHash.count 
            + pSchema->trigHash.count
            + pSchema->idxHash.count
            + pSchema->fkeyHash.count
          );
          nByte += sqlite3MallocSize(pSchema->tblHash.ht);
          nByte += sqlite3MallocSize(pSchema->trigHash.ht);
          nByte += sqlite3MallocSize(pSchema->idxHash.ht);
          nByte += sqlite3MallocSize(pSchema->fkeyHash.ht);

          for(p=sqliteHashFirst(&pSchema->trigHash); p; p=sqliteHashNext(p)){
            sqlite3DeleteTrigger(db, (Trigger*)sqliteHashData(p));
          }
          for(p=sqliteHashFirst(&pSchema->tblHash); p; p=sqliteHashNext(p)){
            sqlite3DeleteTable(db, (Table *)sqliteHashData(p));
          }
        }
      }
      db->pnBytesFreed = 0;
      sqlite3BtreeLeaveAll(db);

      *pHighwater = 0;
      *pCurrent = nByte;
      break;
    }

    /*
    ** *pCurrent gets an accurate estimate of the amount of memory used
    ** to store all prepared statements.
    ** *pHighwater is set to zero.
    */
    case SQLITE_DBSTATUS_STMT_USED: {
      struct Vdbe *pVdbe;         /* Used to iterate through VMs */
      int nByte = 0;              /* Used to accumulate return value */

      db->pnBytesFreed = &nByte;
      for(pVdbe=db->pVdbe; pVdbe; pVdbe=pVdbe->pNext){
        sqlite3VdbeClearObject(db, pVdbe);
        sqlite3DbFree(db, pVdbe);
      }
      db->pnBytesFreed = 0;

      *pHighwater = 0;
      *pCurrent = nByte;

      break;
    }

    /*
    ** Set *pCurrent to the total cache hits or misses encountered by all
    ** pagers the database handle is connected to. *pHighwater is always set 
    ** to zero.
    */
    case SQLITE_DBSTATUS_CACHE_HIT:
    case SQLITE_DBSTATUS_CACHE_MISS:
    case SQLITE_DBSTATUS_CACHE_WRITE:{
      int i;
      int nRet = 0;
      assert( SQLITE_DBSTATUS_CACHE_MISS==SQLITE_DBSTATUS_CACHE_HIT+1 );
      assert( SQLITE_DBSTATUS_CACHE_WRITE==SQLITE_DBSTATUS_CACHE_HIT+2 );

      for(i=0; i<db->nDb; i++){
        if( db->aDb[i].pBt ){
          Pager *pPager = sqlite3BtreePager(db->aDb[i].pBt);
          sqlite3PagerCacheStat(pPager, op, resetFlag, &nRet);
        }
      }
      *pHighwater = 0;
      *pCurrent = nRet;
      break;
    }

    default: {
      rc = SQLITE_ERROR;
    }
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}